

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

bool anon_unknown.dwarf_1ab374::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  bool bVar1;
  int unaff_retaddr;
  Array2D<Imath_3_2::half> *in_stack_00000018;
  
  bVar1 = checkPixels<Imath_3_2::half>
                    (in_stack_00000018,ph._4_4_,(int)ph,width,height,unaff_retaddr);
  return bVar1;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}